

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O0

void __thiscall ot::commissioner::tlv::Tlv::Serialize(Tlv *this,ByteArray *aBuf)

{
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar1;
  Type e;
  type aInteger;
  bool bVar2;
  uint16_t uVar3;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  const_iterator local_28;
  undefined1 local_19;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvStack_18;
  bool condition;
  ByteArray *aBuf_local;
  Tlv *this_local;
  
  pvStack_18 = (vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf;
  aBuf_local = (ByteArray *)this;
  local_19 = IsValid(this);
  pvVar1 = pvStack_18;
  if ((bool)local_19) {
    e = GetType(this);
    aInteger = utils::to_underlying<ot::commissioner::tlv::Type>(e);
    utils::Encode<unsigned_char>((ByteArray *)pvVar1,aInteger);
    bVar2 = IsExtendedTlv(this->mType);
    pvVar1 = pvStack_18;
    if (bVar2) {
      utils::Encode<unsigned_char>((ByteArray *)pvStack_18,0xff);
      pvVar1 = pvStack_18;
      uVar3 = GetLength(this);
      utils::Encode<unsigned_short>((ByteArray *)pvVar1,uVar3);
    }
    else {
      uVar3 = GetLength(this);
      utils::Encode<unsigned_char>((ByteArray *)pvVar1,(uint8_t)uVar3);
    }
    pvVar1 = pvStack_18;
    local_30._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvStack_18);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_28,&local_30);
    __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->mValue);
    __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->mValue);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (pvVar1,local_28,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__first._M_current,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__last._M_current);
    return;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/tlv.cpp"
                ,0x7c,"void ot::commissioner::tlv::Tlv::Serialize(ByteArray &) const");
}

Assistant:

void Tlv::Serialize(ByteArray &aBuf) const
{
    ASSERT(IsValid());

    utils::Encode(aBuf, utils::to_underlying(GetType()));

    // TODO(wgtdkp): Thread 1.2 allows extended TLVs use
    // the base TLV format if its length does not exceed
    // 254 bytes. But OpenThread currently does not support
    // this kind of encoding.
    if (IsExtendedTlv(mType))
    {
        // if (GetLength() >= kEscapeLength) {
        utils::Encode(aBuf, kEscapeLength);
        utils::Encode(aBuf, GetLength());
    }
    else
    {
        utils::Encode(aBuf, static_cast<uint8_t>(GetLength()));
    }

    aBuf.insert(aBuf.end(), mValue.begin(), mValue.end());
}